

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  MessageOptions *pMVar4;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar5;
  Type *descriptor;
  FieldDescriptor **ppFVar6;
  OneofOptions *pOVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int i;
  long lVar12;
  int i_3;
  int i_2;
  SubstituteArg *in_stack_fffffffffffffd68;
  SubstituteArg local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  string local_50;
  
  if (*(long *)(message + 0x20) == 0) {
    pMVar4 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar4;
  }
  lVar10 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(message + 0x48); lVar12 = lVar12 + 1) {
    lVar2 = *(long *)(message + 0x50);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar12);
    CrossLinkMessage(this,(Descriptor *)(lVar2 + lVar10),proto_00);
    lVar10 = lVar10 + 0xa8;
  }
  lVar10 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(message + 0x58); lVar12 = lVar12 + 1) {
    lVar2 = *(long *)(message + 0x60);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar12);
    CrossLinkEnum(this,(EnumDescriptor *)(lVar2 + lVar10),proto_01);
    lVar10 = lVar10 + 0x38;
  }
  lVar10 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(message + 0x2c); lVar12 = lVar12 + 1) {
    lVar2 = *(long *)(message + 0x30);
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar12);
    CrossLinkField(this,(FieldDescriptor *)(lVar2 + lVar10),pTVar5);
    lVar10 = lVar10 + 0xa8;
  }
  lVar10 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(message + 0x78); lVar12 = lVar12 + 1) {
    lVar2 = *(long *)(message + 0x80);
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar12);
    CrossLinkField(this,(FieldDescriptor *)(lVar2 + lVar10),pTVar5);
    lVar10 = lVar10 + 0xa8;
  }
  lVar12 = -0xa8;
  for (lVar10 = 0; lVar10 < *(int *)(message + 0x2c); lVar10 = lVar10 + 1) {
    plVar3 = *(long **)(*(long *)(message + 0x30) + 0x108 + lVar12);
    if (plVar3 != (long *)0x0) {
      if ((0 < *(int *)((long)plVar3 + 0x1c)) &&
         (*(long **)(*(long *)(message + 0x30) + 0x60 + lVar12) != plVar3)) {
        std::operator+(&local_210,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (message + 8),".");
        std::operator+(&local_1f0,&local_210,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(message + 0x30) + lVar12));
        pTVar5 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar10 + -1);
        local_240._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(message + 0x30) + lVar12);
        local_240._M_string_length._0_4_ =
             *(undefined4 *)(*(undefined8 **)(*(long *)(message + 0x30) + lVar12) + 1);
        local_270.text_ = *(char **)*plVar3;
        local_270.size_ = *(int *)((undefined8 *)*plVar3 + 1);
        local_80.text_ = (char *)0x0;
        local_80.size_ = -1;
        local_b0.text_ = (char *)0x0;
        local_b0.size_ = -1;
        local_e0.text_ = (char *)0x0;
        local_e0.size_ = -1;
        local_110.text_ = (char *)0x0;
        local_110.size_ = -1;
        local_140.text_ = (char *)0x0;
        local_140.size_ = -1;
        local_170.text_ = (char *)0x0;
        local_170.size_ = -1;
        local_1a0.text_ = (char *)0x0;
        local_1a0.size_ = -1;
        local_1d0.text_ = (char *)0x0;
        local_1d0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_50,
                   (strings *)
                   "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                   ,(char *)&local_240,&local_270,&local_80,&local_b0,&local_e0,&local_110,
                   &local_140,&local_170,&local_1a0,&local_1d0,in_stack_fffffffffffffd68);
        AddError(this,&local_1f0,&pTVar5->super_Message,OTHER,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
      }
      piVar1 = (int *)(*(long *)(message + 0x40) + 0x1c +
                      (long)(int)(((long)plVar3 - *(long *)(plVar3[2] + 0x40)) / 0x30) * 0x30);
      *piVar1 = *piVar1 + 1;
    }
    lVar12 = lVar12 + 0xa8;
  }
  lVar10 = 0x28;
  for (lVar12 = 0; lVar12 < *(int *)(message + 0x38); lVar12 = lVar12 + 1) {
    lVar2 = *(long *)(message + 0x40);
    iVar11 = *(int *)(lVar2 + -0xc + lVar10);
    if (iVar11 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270
                     ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (message + 8),".");
      std::operator+(&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270
                     ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (lVar2 + -0x28 + lVar10));
      descriptor = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                             (&(proto->oneof_decl_).super_RepeatedPtrFieldBase,(int)lVar12);
      AddError(this,&local_240,&descriptor->super_Message,NAME,"Oneof must have at least one field."
              );
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_270);
      iVar11 = *(int *)(lVar2 + -0xc + lVar10);
    }
    ppFVar6 = DescriptorPool::Tables::AllocateArray<google::protobuf::FieldDescriptor_const*>
                        (this->tables_,iVar11);
    *(FieldDescriptor ***)(lVar2 + -8 + lVar10) = ppFVar6;
    *(undefined4 *)(lVar2 + -0xc + lVar10) = 0;
    if (*(long *)(lVar2 + lVar10) == 0) {
      pOVar7 = OneofOptions::default_instance();
      *(OneofOptions **)(lVar2 + lVar10) = pOVar7;
    }
    lVar10 = lVar10 + 0x30;
  }
  uVar9 = 0;
  uVar8 = (ulong)*(uint *)(message + 0x2c);
  if ((int)*(uint *)(message + 0x2c) < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 * 0xa8 - uVar9 != 0; uVar9 = uVar9 + 0xa8) {
    lVar10 = *(long *)(message + 0x30);
    lVar12 = *(long *)(lVar10 + 0x60 + uVar9);
    if (lVar12 != 0) {
      lVar2 = *(long *)(message + 0x40);
      lVar12 = (long)(int)((lVar12 - *(long *)(*(long *)(lVar12 + 0x10) + 0x40)) / 0x30) * 0x30;
      iVar11 = *(int *)(lVar2 + 0x1c + lVar12);
      *(int *)(lVar10 + 0x54 + uVar9) = iVar11;
      *(int *)(lVar2 + 0x1c + lVar12) = iVar11 + 1;
      *(ulong *)(*(long *)(lVar2 + 0x20 + lVar12) + (long)iVar11 * 8) = lVar10 + uVar9;
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(
    Descriptor* message, const DescriptorProto& proto) {
  if (message->options_ == NULL) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != NULL) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(
            message->full_name() + "." + message->field(i - 1)->name(),
            proto.field(i - 1), DescriptorPool::ErrorCollector::OTHER,
            strings::Substitute(
                "Fields in the same oneof must be defined consecutively. "
                "\"$0\" cannot be defined before the completion of the "
                "\"$1\" oneof definition.",
                message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i),
               DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ =
      tables_->AllocateArray<const FieldDescriptor*>(oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == NULL) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != NULL) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }
}